

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

unsigned_long_long
ImGui::RoundScalarWithFormatT<unsigned_long_long,long_long>
          (char *format,ImGuiDataType data_type,unsigned_long_long v)

{
  char *src;
  ulong in_RDX;
  int in_ESI;
  char *in_RDI;
  double dVar1;
  char *p;
  char v_str [64];
  char fmt_sanitized [32];
  char *fmt_start;
  size_t in_stack_ffffffffffffff70;
  char *in_stack_ffffffffffffff78;
  char *in_stack_ffffffffffffff80;
  char local_48 [32];
  char *local_28;
  ulong local_20;
  int local_14;
  ulong local_8;
  
  local_20 = in_RDX;
  local_14 = in_ESI;
  local_28 = ImParseFormatFindStart(in_RDI);
  if ((*local_28 == '%') && (local_28[1] != '%')) {
    SanitizeFormatString
              (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
    local_28 = local_48;
    ImFormatString(&stack0xffffffffffffff78,0x40,local_28,local_20);
    for (src = &stack0xffffffffffffff78; *src == ' '; src = src + 1) {
    }
    if ((local_14 == 8) || (local_14 == 9)) {
      dVar1 = atof(src);
      local_20 = (long)dVar1 | (long)(dVar1 - 9.223372036854776e+18) & (long)dVar1 >> 0x3f;
    }
    else {
      ImAtoi<long_long>(src,(longlong *)&local_20);
    }
    local_8 = local_20;
  }
  else {
    local_8 = local_20;
  }
  return local_8;
}

Assistant:

TYPE ImGui::RoundScalarWithFormatT(const char* format, ImGuiDataType data_type, TYPE v)
{
    const char* fmt_start = ImParseFormatFindStart(format);
    if (fmt_start[0] != '%' || fmt_start[1] == '%') // Don't apply if the value is not visible in the format string
        return v;

    // Sanitize format
    char fmt_sanitized[32];
    SanitizeFormatString(fmt_start, fmt_sanitized, IM_ARRAYSIZE(fmt_sanitized));
    fmt_start = fmt_sanitized;

    // Format value with our rounding, and read back
    char v_str[64];
    ImFormatString(v_str, IM_ARRAYSIZE(v_str), fmt_start, v);
    const char* p = v_str;
    while (*p == ' ')
        p++;
    if (data_type == ImGuiDataType_Float || data_type == ImGuiDataType_Double)
        v = (TYPE)ImAtof(p);
    else
        ImAtoi(p, (SIGNEDTYPE*)&v);
    return v;
}